

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

string_view __thiscall Radix_tree::find(Radix_tree *this,string_view key)

{
  char cVar1;
  bool bVar2;
  reference this_00;
  char *pcVar3;
  string_view sVar4;
  Node *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_> *__range1;
  Radix_tree *local_30;
  Radix_tree *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (Radix_tree *)key._M_len;
  local_30 = this;
  bVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
          empty((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __range1._7_1_ = (bVar2 ^ 0xffU) & 1;
  assume<bool>((bool *)((long)&__range1 + 7));
  __end1 = std::vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>::begin(&this->children);
  child = (Node *)std::vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>::end
                            (&this->children);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Radix_tree::Node_*,_std::vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>_>
                                *)&child);
    if (!bVar2) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&key_local._M_str);
      return stack0xffffffffffffffe8;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Radix_tree::Node_*,_std::vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>_>
              ::operator*(&__end1);
    pcVar3 = (char *)std::__cxx11::string::front();
    cVar1 = *pcVar3;
    pcVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             front((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (cVar1 == *pcVar3) break;
    __gnu_cxx::
    __normal_iterator<const_Radix_tree::Node_*,_std::vector<Radix_tree::Node,_std::allocator<Radix_tree::Node>_>_>
    ::operator++(&__end1);
  }
  sVar4._M_str = (char *)key_local._M_len;
  sVar4._M_len = (size_t)this_local;
  sVar4 = Node::find(this_00,sVar4);
  return sVar4;
}

Assistant:

string_view Radix_tree::find(string_view key) const {
	assume(!key.empty()); //not sure what to do in this case yet
	for (auto &child : children) {
		if (child.key_part.front() == key.front()) {
			return child.find(key);
		}
	}
	return {};
}